

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RtreeSearchPoint * rtreeSearchPointNew(RtreeCursor *pCur,RtreeDValue rScore,u8 iLevel)

{
  u8 uVar1;
  u8 uVar2;
  undefined5 uVar3;
  int iVar4;
  RtreeSearchPoint *pRVar5;
  int ii;
  RtreeSearchPoint *pFirst;
  RtreeSearchPoint *pNew;
  u8 iLevel_local;
  RtreeDValue rScore_local;
  RtreeCursor *pCur_local;
  
  pRVar5 = rtreeSearchPointFirst(pCur);
  pCur->anQueue[iLevel] = pCur->anQueue[iLevel] + 1;
  if ((pRVar5 != (RtreeSearchPoint *)0x0) && (pRVar5->rScore <= rScore)) {
    if ((pRVar5->rScore != rScore) ||
       ((NAN(pRVar5->rScore) || NAN(rScore) || (pRVar5->iLevel <= iLevel)))) {
      pRVar5 = rtreeEnqueue(pCur,rScore,iLevel);
      return pRVar5;
    }
  }
  if (pCur->bPoint != '\0') {
    pRVar5 = rtreeEnqueue(pCur,rScore,iLevel);
    if (pRVar5 == (RtreeSearchPoint *)0x0) {
      return (RtreeSearchPoint *)0x0;
    }
    iVar4 = (int)(((long)pRVar5 - (long)pCur->aPoint) / 0x18) + 1;
    if (iVar4 < 5) {
      pCur->aNode[iVar4] = pCur->aNode[0];
    }
    else {
      nodeRelease((Rtree *)(pCur->base).pVtab,pCur->aNode[0]);
    }
    pCur->aNode[0] = (RtreeNode *)0x0;
    pRVar5->rScore = (pCur->sPoint).rScore;
    pRVar5->id = (pCur->sPoint).id;
    uVar1 = (pCur->sPoint).eWithin;
    uVar2 = (pCur->sPoint).iCell;
    uVar3 = *(undefined5 *)&(pCur->sPoint).field_0x13;
    pRVar5->iLevel = (pCur->sPoint).iLevel;
    pRVar5->eWithin = uVar1;
    pRVar5->iCell = uVar2;
    *(undefined5 *)&pRVar5->field_0x13 = uVar3;
  }
  (pCur->sPoint).rScore = rScore;
  (pCur->sPoint).iLevel = iLevel;
  pCur->bPoint = '\x01';
  return &pCur->sPoint;
}

Assistant:

static RtreeSearchPoint *rtreeSearchPointNew(
  RtreeCursor *pCur,    /* The cursor */
  RtreeDValue rScore,   /* Score for the new search point */
  u8 iLevel             /* Level for the new search point */
){
  RtreeSearchPoint *pNew, *pFirst;
  pFirst = rtreeSearchPointFirst(pCur);
  pCur->anQueue[iLevel]++;
  if( pFirst==0
   || pFirst->rScore>rScore 
   || (pFirst->rScore==rScore && pFirst->iLevel>iLevel)
  ){
    if( pCur->bPoint ){
      int ii;
      pNew = rtreeEnqueue(pCur, rScore, iLevel);
      if( pNew==0 ) return 0;
      ii = (int)(pNew - pCur->aPoint) + 1;
      if( ii<RTREE_CACHE_SZ ){
        assert( pCur->aNode[ii]==0 );
        pCur->aNode[ii] = pCur->aNode[0];
      }else{
        nodeRelease(RTREE_OF_CURSOR(pCur), pCur->aNode[0]);
      }
      pCur->aNode[0] = 0;
      *pNew = pCur->sPoint;
    }
    pCur->sPoint.rScore = rScore;
    pCur->sPoint.iLevel = iLevel;
    pCur->bPoint = 1;
    return &pCur->sPoint;
  }else{
    return rtreeEnqueue(pCur, rScore, iLevel);
  }
}